

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map_entry_lite.h
# Opt level: O0

void __thiscall
google::protobuf::internal::
MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
::MergeFromInternal(MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                    *this,MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
                          *from)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  Arena *pAVar3;
  undefined4 extraout_var_00;
  MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *from_local;
  MapEntryImpl<CoreML::Specification::MILSpec::TensorType_AttributesEntry_DoNotUse,_google::protobuf::MessageLite,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_CoreML::Specification::MILSpec::Value,_(google::protobuf::internal::WireFormatLite::FieldType)9,_(google::protobuf::internal::WireFormatLite::FieldType)11>
  *this_local;
  
  if (from->_has_bits_[0] != 0) {
    bVar1 = has_key(from);
    if (bVar1) {
      pAVar3 = MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::EnsureMutable(&this->key_,pAVar3);
      iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[0xd])();
      pAVar3 = MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)9,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Merge((MapEntryAccessorType *)CONCAT44(extraout_var,iVar2),&this->key_,pAVar3);
      set_has_key(this);
    }
    bVar1 = has_value(from);
    if (bVar1) {
      pAVar3 = MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::MILSpec::Value>
      ::EnsureMutable(&this->value_,pAVar3);
      iVar2 = (*(from->super_MessageLite)._vptr_MessageLite[0xe])();
      pAVar3 = MessageLite::GetArenaForAllocation(&this->super_MessageLite);
      MapTypeHandler<(google::protobuf::internal::WireFormatLite::FieldType)11,_CoreML::Specification::MILSpec::Value>
      ::Merge((Value *)CONCAT44(extraout_var_00,iVar2),&this->value_,pAVar3);
      set_has_value(this);
    }
  }
  return;
}

Assistant:

void MergeFromInternal(const MapEntryImpl& from) {
    if (from._has_bits_[0]) {
      if (from.has_key()) {
        KeyTypeHandler::EnsureMutable(&key_, Base::GetArenaForAllocation());
        KeyTypeHandler::Merge(from.key(), &key_, Base::GetArenaForAllocation());
        set_has_key();
      }
      if (from.has_value()) {
        ValueTypeHandler::EnsureMutable(&value_, Base::GetArenaForAllocation());
        ValueTypeHandler::Merge(from.value(), &value_,
                                Base::GetArenaForAllocation());
        set_has_value();
      }
    }
  }